

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O0

void OpenSteer::OpenSteerDemo::gridUtility(Vec3 *gridTarget)

{
  float *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  Color gray2;
  Color gray1;
  Vec3 gridCenter;
  Color *in_stack_000000d8;
  Color *in_stack_000000e0;
  Vec3 *in_stack_000000e8;
  int in_stack_000000f0;
  float in_stack_000000f4;
  Color local_34;
  Color local_24;
  Vec3 local_14;
  float *local_8;
  
  local_8 = in_RDI;
  dVar1 = round((double)(ulong)(uint)(*in_RDI * 0.5));
  dVar2 = round((double)(ulong)(uint)(local_8[1] * 0.5));
  dVar3 = round((double)(ulong)(uint)(local_8[2] * 0.5));
  Vec3::Vec3(&local_14,SUB84(dVar1,0) * 2.0,SUB84(dVar2,0) + SUB84(dVar2,0) + -0.05,
             SUB84(dVar3,0) * 2.0);
  Color::Color(&local_24,0.27);
  Color::Color(&local_34,0.3);
  drawXZCheckerboardGrid
            (in_stack_000000f4,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
             in_stack_000000d8);
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::gridUtility (const Vec3& gridTarget)
{
    // round off target to the nearest multiple of 2 (because the
    // checkboard grid with a pitch of 1 tiles with a period of 2)
    // then lower the grid a bit to put it under 2d annotation lines
    const Vec3 gridCenter ((round (gridTarget.x * 0.5f) * 2),
                           (round (gridTarget.y * 0.5f) * 2) - .05f,
                           (round (gridTarget.z * 0.5f) * 2));

    // colors for checkboard
    const Color gray1(0.27f);
    const Color gray2(0.30f);

    // draw 50x50 checkerboard grid with 50 squares along each side
    drawXZCheckerboardGrid (50, 50, gridCenter, gray1, gray2);

    // alternate style
    // drawXZLineGrid (50, 50, gridCenter, gBlack);
}